

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

void erkStep_Free(ARKodeMem ark_mem)

{
  long in_RDI;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw;
  sunindextype Bliw;
  int j;
  N_Vector *v;
  ARKodeMem in_stack_ffffffffffffffe0;
  long local_18;
  int local_c;
  long local_8;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x88) != 0)) {
    v = *(N_Vector **)(in_RDI + 0x88);
    local_8 = in_RDI;
    if (v[4] != (N_Vector)0x0) {
      ARKodeButcherTable_Space
                ((ARKodeButcherTable)v[4],&local_18,(sunindextype *)&stack0xffffffffffffffe0);
      ARKodeButcherTable_Free((ARKodeButcherTable)in_stack_ffffffffffffffe0);
      v[4] = (N_Vector)0x0;
      *(long *)(local_8 + 0x350) = *(long *)(local_8 + 0x350) - local_18;
      *(long *)(local_8 + 0x348) = *(long *)(local_8 + 0x348) - (long)in_stack_ffffffffffffffe0;
    }
    if (v[1] != (N_Vector)0x0) {
      for (local_c = 0; local_c < *(int *)(v + 3); local_c = local_c + 1) {
        arkFreeVec(in_stack_ffffffffffffffe0,v);
      }
      free(v[1]);
      v[1] = (N_Vector)0x0;
      *(long *)(local_8 + 0x350) = *(long *)(local_8 + 0x350) - (long)*(int *)(v + 3);
    }
    if (v[6] != (N_Vector)0x0) {
      free(v[6]);
      v[6] = (N_Vector)0x0;
      *(long *)(local_8 + 0x348) = *(long *)(local_8 + 0x348) - (long)(*(int *)(v + 3) + 1);
    }
    if (v[7] != (N_Vector)0x0) {
      free(v[7]);
      v[7] = (N_Vector)0x0;
      *(long *)(local_8 + 0x350) = *(long *)(local_8 + 0x350) - (long)(*(int *)(v + 3) + 1);
    }
    free(*(void **)(local_8 + 0x88));
    *(undefined8 *)(local_8 + 0x88) = 0;
  }
  return;
}

Assistant:

void erkStep_Free(ARKodeMem ark_mem)
{
  int j;
  sunindextype Bliw, Blrw;
  ARKodeERKStepMem step_mem;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL ERKStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

    /* free the Butcher table */
    if (step_mem->B != NULL)
    {
      ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
      ARKodeButcherTable_Free(step_mem->B);
      step_mem->B = NULL;
      ark_mem->liw -= Bliw;
      ark_mem->lrw -= Blrw;
    }

    /* free the RHS vectors */
    if (step_mem->F != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->F[j]);
      }
      free(step_mem->F);
      step_mem->F = NULL;
      ark_mem->liw -= step_mem->stages;
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL)
    {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= (step_mem->stages + 1);
    }
    if (step_mem->Xvecs != NULL)
    {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= (step_mem->stages + 1);
    }

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}